

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O2

QCborValue * __thiscall
StashedContainer::intoValue
          (QCborValue *__return_storage_ptr__,StashedContainer *this,
          QExplicitlySharedDataPointer<QCborContainerPrivate> *parent)

{
  Type TVar1;
  QCborContainerPrivate *pQVar2;
  QCborValue *result;
  
  std::swap<QExplicitlySharedDataPointer<QCborContainerPrivate>>(&this->stashed,parent);
  TVar1 = this->type;
  pQVar2 = (this->stashed).d.ptr;
  (this->stashed).d.ptr = (QCborContainerPrivate *)0x0;
  *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->t = TVar1;
  __return_storage_ptr__->n = -1;
  __return_storage_ptr__->container = pQVar2;
  return __return_storage_ptr__;
}

Assistant:

QCborValue intoValue(QExplicitlySharedDataPointer<QCborContainerPrivate> *parent)
    {
        std::swap(stashed, *parent);
        return QCborContainerPrivate::makeValue(type, -1, stashed.take(),
                                                QCborContainerPrivate::MoveContainer);
    }